

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void in1_r2_sr32(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int iVar1;
  TCGv_i64 ret;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx);
  o->in1 = ret;
  iVar1 = get_field1(s,FLD_O_r2,FLD_C_b2);
  tcg_gen_shri_i64_s390x(tcg_ctx,ret,tcg_ctx->regs[iVar1],0x20);
  return;
}

Assistant:

static void in1_r2_sr32(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    o->in1 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_shri_i64(tcg_ctx, o->in1, tcg_ctx->regs[get_field(s, r2)], 32);
}